

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_17::CrlCheckingPathBuilderDelegate::CheckPathAfterVerification
          (CrlCheckingPathBuilderDelegate *this,CertPathBuilder *path_builder,
          CertPathBuilderResultPath *path)

{
  pointer pbVar1;
  optional<long> max_age_seconds;
  bool bVar2;
  ParsedDistributionPoint *pPVar3;
  bool bVar4;
  internal iVar5;
  CRLRevocationStatus CVar6;
  CertErrors *pCVar7;
  ParsedExtension *parsed_extension;
  ParsedDistributionPoint *pPVar8;
  ulong uVar9;
  ParsedDistributionPoint *pPVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *der_crl;
  pointer pbVar11;
  char *in_R9;
  long lVar12;
  ulong uVar13;
  size_t target_cert_index;
  uint uVar14;
  uint uVar15;
  Input extension_oid;
  Input extension_value;
  string_view raw_crl;
  AssertionResult gtest_ar_;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
  distribution_points;
  ParsedExtension crl_dp_extension;
  ParsedDistributionPoint fake_cert_dp;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  internal local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  CertPathErrors *local_128;
  AssertHelper local_120;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> local_118;
  char *local_f8;
  CertificateTrust *local_f0;
  ulong local_e8;
  char *local_e0;
  string local_d8;
  _Storage<long,_true> local_b8;
  undefined1 uStack_b0;
  undefined7 uStack_af;
  ParsedExtension local_a8;
  ParsedDistributionPoint local_80;
  
  SimplePathBuilderDelegate::CheckPathAfterVerification
            (&this->super_SimplePathBuilderDelegate,path_builder,path);
  bVar4 = CertPathBuilderResultPath::IsValid(path);
  if ((bVar4) &&
     (lVar12 = (long)(path->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(path->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, lVar12 != 0)) {
    uVar13 = lVar12 >> 4;
    local_f0 = &path->last_cert_trust;
    local_128 = &path->errors;
    local_e0 = "Certificate is revoked";
    local_f8 = "Unable to check revocation";
    uVar9 = 0;
    do {
      if (uVar9 == 0) {
        bVar4 = CertificateTrust::IsTrustAnchor(local_f0);
        uVar15 = 0;
        if (!bVar4) goto LAB_002acf11;
      }
      else {
LAB_002acf11:
        target_cert_index = uVar13 + ~uVar9;
        local_e8 = uVar9;
        ParsedDistributionPoint::ParsedDistributionPoint(&local_80);
        local_118.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_start = (ParsedDistributionPoint *)0x0;
        local_118.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ParsedDistributionPoint *)0x0;
        local_118.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value.data_.data_ = (uchar *)0x0;
        local_a8.value.data_.size_ = 0;
        local_a8.oid.data_.data_ = (uchar *)0x0;
        local_a8.oid.data_.size_ = 0;
        local_a8.critical = false;
        parsed_extension = &local_a8;
        extension_oid.data_.size_ = 3;
        extension_oid.data_.data_ = "U\x1d\x1fEncodeValuesTest";
        bVar4 = ParsedCertificate::GetExtension
                          ((path->certs).
                           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[target_cert_index].
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,extension_oid,parsed_extension);
        pPVar10 = &local_80;
        if (bVar4) {
          extension_value.data_.size_ = (size_t)&local_118;
          extension_value.data_.data_ = (uchar *)local_a8.value.data_.size_;
          iVar5 = (internal)
                  ParseCrlDistributionPoints
                            ((bssl *)local_a8.value.data_.data_,extension_value,
                             (vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                              *)parsed_extension);
          local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pPVar3 = local_118.
                   super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138[0] = iVar5;
          if ((bool)iVar5) {
joined_r0x002ad089:
            do {
              pPVar8 = pPVar10;
              if (pPVar3 == local_118.
                            super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish) break;
              bVar4 = (pPVar3->reasons).super__Optional_base<bssl::der::Input,_true,_true>.
                      _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged;
              pPVar8 = pPVar3;
              if (bVar4 != false) {
                pPVar8 = pPVar10;
              }
              pPVar10 = pPVar8;
              pPVar3 = pPVar3 + 1;
            } while (bVar4 == true);
            pPVar10 = local_118.
                      super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_118.
                super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_118.
                super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pPVar10 = pPVar8;
            }
            if (pPVar8 != &local_80) {
              pPVar10 = pPVar8;
            }
            goto LAB_002ad0c4;
          }
          testing::Message::Message((Message *)&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_d8,local_138,
                     (AssertionResult *)
                     "ParseCrlDistributionPoints(crl_dp_extension.value, &distribution_points)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                     ,0x58,local_d8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_140);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (local_140._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_140._M_head_impl + 8))();
          }
          if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_130,local_130);
          }
          uVar15 = 1;
          pPVar3 = local_118.
                   super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((bool)iVar5) goto joined_r0x002ad089;
        }
        else {
LAB_002ad0c4:
          pbVar11 = (this->der_crls_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (this->der_crls_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar11 == pbVar1) {
            uVar14 = 7;
            bVar4 = false;
          }
          else {
            bVar4 = false;
            do {
              in_R9 = (char *)this->verify_time_;
              local_b8 = (_Storage<long,_true>)this->max_age_;
              uStack_b0 = 1;
              max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._9_7_ = uStack_af;
              max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged = true;
              max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload =
                   (_Storage<long,_true>)(_Storage<long,_true>)local_b8._M_value;
              raw_crl._M_str = (pbVar11->_M_dataplus)._M_p;
              raw_crl._M_len = pbVar11->_M_string_length;
              CVar6 = CheckCRL(raw_crl,&path->certs,target_cert_index,pPVar10,(int64_t)in_R9,
                               max_age_seconds);
              if (CVar6 == GOOD) {
                uVar14 = 7;
                bVar4 = true;
LAB_002ad153:
                bVar2 = false;
              }
              else {
                if (CVar6 == REVOKED) {
                  pCVar7 = CertPathErrors::GetErrorsForCert(local_128,target_cert_index);
                  CertErrors::AddError(pCVar7,local_e0);
                  uVar14 = 1;
                  goto LAB_002ad153;
                }
                uVar14 = 0;
                bVar2 = true;
              }
              if (!bVar2) goto LAB_002ad181;
              pbVar11 = pbVar11 + 1;
            } while (pbVar11 != pbVar1);
            uVar14 = 7;
          }
LAB_002ad181:
          uVar15 = uVar14;
          if (uVar14 == 7) {
            uVar15 = 0;
          }
          if (uVar14 == 7 && !bVar4) {
            pCVar7 = CertPathErrors::GetErrorsForCert(local_128,target_cert_index);
            uVar15 = 0;
            CertErrors::AddError(pCVar7,local_f8);
          }
        }
        ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ::~vector(&local_118);
        ParsedDistributionPoint::~ParsedDistributionPoint(&local_80);
        uVar9 = local_e8;
      }
      if ((uVar15 & 3) != 0) {
        return;
      }
      uVar9 = uVar9 + 1;
      uVar13 = (long)(path->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(path->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
    } while (uVar9 < uVar13);
  }
  return;
}

Assistant:

void CheckPathAfterVerification(const CertPathBuilder &path_builder,
                                  CertPathBuilderResultPath *path) override {
    SimplePathBuilderDelegate::CheckPathAfterVerification(path_builder, path);

    if (!path->IsValid()) {
      return;
    }

    // It would be preferable if this test could use
    // CheckValidatedChainRevocation somehow, but that only supports getting
    // CRLs by http distributionPoints. So this just settles for writing a
    // little bit of wrapper code to test CheckCRL directly.
    const ParsedCertificateList &certs = path->certs;
    for (size_t reverse_i = 0; reverse_i < certs.size(); ++reverse_i) {
      size_t i = certs.size() - reverse_i - 1;

      // Trust anchors bypass OCSP/CRL revocation checks. (The only way to
      // revoke trust anchors is via CRLSet or the built-in SPKI block list).
      if (reverse_i == 0 && path->last_cert_trust.IsTrustAnchor()) {
        continue;
      }

      // RFC 5280 6.3.3.  [If the CRL was not specified in a distribution
      //                  point], assume a DP with both the reasons and the
      //                  cRLIssuer fields omitted and a distribution point
      //                  name of the certificate issuer.
      // Since this implementation only supports URI names in distribution
      // points, this means a default-initialized ParsedDistributionPoint is
      // sufficient.
      ParsedDistributionPoint fake_cert_dp;
      const ParsedDistributionPoint *cert_dp = &fake_cert_dp;

      // If the target cert does have a distribution point, use it.
      std::vector<ParsedDistributionPoint> distribution_points;
      ParsedExtension crl_dp_extension;
      if (certs[i]->GetExtension(der::Input(kCrlDistributionPointsOid),
                                 &crl_dp_extension)) {
        ASSERT_TRUE(ParseCrlDistributionPoints(crl_dp_extension.value,
                                               &distribution_points));
        // TODO(mattm): some test cases (some of the 4.14.* onlySomeReasons
        // tests)) have two CRLs and two distribution points, one point
        // corresponding to each CRL.  Should select the matching point for
        // each CRL.  (Doesn't matter currently since we don't support
        // reasons.)

        // Look for a DistributionPoint without reasons.
        for (const auto &dp : distribution_points) {
          if (!dp.reasons) {
            cert_dp = &dp;
            break;
          }
        }
        // If there were only DistributionPoints with reasons, just use the
        // first one.
        if (cert_dp == &fake_cert_dp && !distribution_points.empty()) {
          cert_dp = &distribution_points[0];
        }
      }

      bool cert_good = false;

      for (const auto &der_crl : der_crls_) {
        CRLRevocationStatus crl_status =
            CheckCRL(der_crl, certs, i, *cert_dp, verify_time_, max_age_);
        if (crl_status == CRLRevocationStatus::REVOKED) {
          path->errors.GetErrorsForCert(i)->AddError(
              cert_errors::kCertificateRevoked);
          return;
        }
        if (crl_status == CRLRevocationStatus::GOOD) {
          cert_good = true;
          break;
        }
      }
      if (!cert_good) {
        // PKITS tests assume hard-fail revocation checking.
        // From PKITS 4.4: "When running the tests in this section, the
        // application should be configured in such a way that the
        // certification path is not accepted unless valid, up-to-date
        // revocation data is available for every certificate in the path."
        path->errors.GetErrorsForCert(i)->AddError(
            cert_errors::kUnableToCheckRevocation);
      }
    }
  }